

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogWrapper.cpp
# Opt level: O2

void LogWrapper::Load(void)

{
  if (s_hModule == (void *)0x0) {
    s_hModule = (void *)dlopen("libmlog.so",2);
    if (s_hModule == (void *)0x0) {
      puts("dlopen libmlog.so failed");
    }
    else {
      puts("dlopen libmlog.so successed");
      s_init = (FN_Init)dlsym(s_hModule,"MLogInit");
      s_uninit = (FN_UnInit)dlsym(s_hModule,"MLogUnInit");
      s_open = (FN_Open)dlsym(s_hModule,"MLogOpen");
      s_close = (FN_Close)dlsym(s_hModule,"MLogClose");
      s_write = (FN_MLogWrite)dlsym(s_hModule,"MLogWrite");
      s_writeHex = (FN_MLogWriteHex)dlsym(s_hModule,"MLogWriteHex");
    }
    if (s_init != (FN_Init)0x0) {
      (*s_init)();
      return;
    }
  }
  return;
}

Assistant:

void LogWrapper::Load()
{
	if(s_hModule != NULL)
		return;
#ifdef _WIN32
	char lpszPath[1024];
	dd::GetCurrentDir(lpszPath, 1024);
	strcat(lpszPath, "mlog.dll");
	s_hModule = ::LoadLibraryA(lpszPath);
	if(!s_hModule)
		return;
	s_init =(FN_Init)::GetProcAddress(s_hModule, "MLogInit");
	s_uninit =(FN_UnInit)::GetProcAddress(s_hModule, "MLogUnInit");
	s_open =(FN_Open)::GetProcAddress(s_hModule, "MLogOpen");
	s_close = (FN_Close)::GetProcAddress(s_hModule, "MLogClose");
	s_write = (FN_MLogWrite)::GetProcAddress(s_hModule, "MLogWrite");
	s_writeHex = (FN_MLogWriteHex)::GetProcAddress(s_hModule, "MLogWriteHex");
#else
	s_hModule = dlopen("libmlog.so", RTLD_NOW);
	if (s_hModule)
	{
		printf("dlopen libmlog.so successed\n");
		s_init =(FN_Init)dlsym(s_hModule, "MLogInit");
		s_uninit =(FN_UnInit)dlsym(s_hModule, "MLogUnInit");
		s_open =(FN_Open)dlsym(s_hModule, "MLogOpen");
		s_close = (FN_Close)dlsym(s_hModule, "MLogClose");
		s_write = (FN_MLogWrite)dlsym(s_hModule, "MLogWrite");
		s_writeHex = (FN_MLogWriteHex)dlsym(s_hModule, "MLogWriteHex");
	}
	else
		printf("dlopen libmlog.so failed\n");
#endif
	if(s_init != NULL)
		s_init();
}